

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_max_fd_shrink(void)

{
  fio_data_s *pfVar1;
  uint32_t uVar2;
  uint uVar3;
  fio_lock_i ret;
  
  fio_lock(&fio_data->lock);
  pfVar1 = fio_data;
  uVar2 = fio_data->max_protocol_fd;
  do {
    uVar3 = uVar2;
    if (uVar3 == 0) break;
    uVar2 = uVar3 - 1;
  } while (*(long *)((long)fio_data + (ulong)uVar3 * 0xa8 + 0x58) == 0);
  fio_data->max_protocol_fd = uVar3;
  LOCK();
  pfVar1->lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static void fio_max_fd_shrink(void) {
  fio_lock(&fio_data->lock);
  uint32_t fd = fio_data->max_protocol_fd;
  while (fd && fd_data(fd).protocol == NULL)
    --fd;
  fio_data->max_protocol_fd = fd;
  fio_unlock(&fio_data->lock);
}